

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

Kit_Graph_t * Kit_GraphCreate(int nLeaves)

{
  int iVar1;
  Kit_Graph_t *pKVar2;
  Kit_Node_t *__s;
  
  pKVar2 = (Kit_Graph_t *)calloc(1,0x20);
  pKVar2->nLeaves = nLeaves;
  pKVar2->nSize = nLeaves;
  iVar1 = nLeaves * 2 + 0x32;
  pKVar2->nCap = iVar1;
  __s = (Kit_Node_t *)malloc((long)iVar1 * 0x18);
  pKVar2->pNodes = __s;
  memset(__s,0,(long)nLeaves * 0x18);
  return pKVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates a graph with the given number of leaves.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Kit_Graph_t * Kit_GraphCreate( int nLeaves )   
{
    Kit_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Kit_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Kit_Graph_t) );
    pGraph->nLeaves = nLeaves;
    pGraph->nSize = nLeaves;
    pGraph->nCap = 2 * nLeaves + 50;
    pGraph->pNodes = ABC_ALLOC( Kit_Node_t, pGraph->nCap );
    memset( pGraph->pNodes, 0, sizeof(Kit_Node_t) * pGraph->nSize );
    return pGraph;
}